

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<char,_false,_false>::grow_and_add
          (FastVector<char,_false,_false> *this,uint newSize,char *valPtr,uint elem)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = this->data;
  grow_no_destroy(this,newSize);
  if (elem != 0) {
    uVar4 = 0;
    do {
      cVar1 = valPtr[uVar4];
      uVar2 = this->count;
      this->count = uVar2 + 1;
      this->data[uVar2] = cVar1;
      uVar4 = uVar4 + 1;
    } while (elem != uVar4);
  }
  if (pcVar3 != (char *)0x0) {
    (*(code *)NULLC::dealloc)(pcVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}